

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode_machine.hpp
# Opt level: O0

void randomx::BytecodeMachine::exe_ISMULH_M
               (InstructionByteCode *ibc,int *pc,uint8_t *scratchpad,ProgramConfiguration *config)

{
  int64_t a;
  uint64_t x;
  int64_t b;
  int_reg_t iVar1;
  uint8_t *in_RDX;
  InstructionByteCode *in_RDI;
  
  a = unsigned64ToSigned2sCompl(*(in_RDI->field_0).idst);
  getScratchpadAddress(in_RDI,in_RDX);
  x = load64((void *)0x153043);
  b = unsigned64ToSigned2sCompl(x);
  iVar1 = smulh(a,b);
  *(in_RDI->field_0).idst = iVar1;
  return;
}

Assistant:

static void exe_ISMULH_M(RANDOMX_EXE_ARGS) {
			*ibc.idst = smulh(unsigned64ToSigned2sCompl(*ibc.idst), unsigned64ToSigned2sCompl(load64(getScratchpadAddress(ibc, scratchpad))));
		}